

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::load_fromArrays
          (HModel *this,int XnumCol,int XobjSense,double *XcolCost,double *XcolLower,
          double *XcolUpper,int XnumRow,double *XrowLower,double *XrowUpper,int XnumNz,int *XAstart,
          int *XAindex,double *XAvalue)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  HModel *in_R8;
  double *in_R9;
  double dVar1;
  undefined4 in_stack_00000008;
  int numNz;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  *(undefined8 *)(in_RDI + 0x568) = 0;
  HTimer::reset((HTimer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *(undefined4 *)(in_RDI + 0x60c) = in_ESI;
  *(undefined4 *)(in_RDI + 0x610) = in_stack_00000008;
  *(undefined4 *)(in_RDI + 0x61c) = in_EDX;
  std::vector<double,std::allocator<double>>::assign<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)in_R8,in_R9,
             (double *)CONCAT44(XcolCost._0_4_,in_stack_ffffffffffffffd0));
  std::vector<double,std::allocator<double>>::assign<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)in_R8,in_R9,
             (double *)CONCAT44(XcolCost._0_4_,in_stack_ffffffffffffffd0));
  std::vector<double,std::allocator<double>>::assign<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)in_R8,in_R9,
             (double *)CONCAT44(XcolCost._0_4_,in_stack_ffffffffffffffd0));
  std::vector<double,std::allocator<double>>::assign<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)in_R8,in_R9,
             (double *)CONCAT44(XcolCost._0_4_,in_stack_ffffffffffffffd0));
  std::vector<double,std::allocator<double>>::assign<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)in_R8,in_R9,
             (double *)CONCAT44(XcolCost._0_4_,in_stack_ffffffffffffffd0));
  std::vector<int,std::allocator<int>>::assign<int_const*,void>
            ((vector<int,_std::allocator<int>_> *)in_R8,(int *)in_R9,
             (int *)CONCAT44(XcolCost._0_4_,in_stack_ffffffffffffffd0));
  std::vector<int,std::allocator<int>>::assign<int_const*,void>
            ((vector<int,_std::allocator<int>_> *)in_R8,(int *)in_R9,
             (int *)CONCAT44(XcolCost._0_4_,in_stack_ffffffffffffffd0));
  std::vector<double,std::allocator<double>>::assign<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)in_R8,in_R9,
             (double *)CONCAT44(XcolCost._0_4_,in_stack_ffffffffffffffd0));
  *(int *)(in_RDI + 0x614) = *(int *)(in_RDI + 0x60c) + *(int *)(in_RDI + 0x610);
  initScale(in_R8);
  initWithLogicalBasis(in_R8);
  dVar1 = HTimer::getTime((HTimer *)CONCAT44(XcolCost._0_4_,in_stack_ffffffffffffffd0));
  *(double *)(in_RDI + 0x568) = dVar1 + *(double *)(in_RDI + 0x568);
  return;
}

Assistant:

void HModel::load_fromArrays(int XnumCol, int XobjSense, const double* XcolCost, const double* XcolLower, const double* XcolUpper,
			     int XnumRow, const double* XrowLower, const double* XrowUpper,
			     int XnumNz, const int* XAstart, const int* XAindex, const double* XAvalue) {
  //  printf("load_fromArrays: XnumCol = %d; XnumRow = %d; XnumNz = %d\n", XnumCol, XnumRow, XnumNz);
  assert(XnumCol > 0);
  assert(XnumRow > 0);

  // Initialise the total runtine for this model
  totalTime = 0;
  // Load the model, timing the process
  timer.reset();

  numCol = XnumCol;
  numRow = XnumRow;
  objSense = XobjSense;
  int numNz = XnumNz;
  colCost.assign(&XcolCost[0], &XcolCost[0] + numCol);
  colLower.assign(&XcolLower[0], &XcolLower[0] + numCol);
  colUpper.assign(&XcolUpper[0], &XcolUpper[0] + numCol);
  rowLower.assign(&XrowLower[0], &XrowLower[0] + numRow);
  rowUpper.assign(&XrowUpper[0], &XrowUpper[0] + numRow);
  Astart.assign(&XAstart[0], &XAstart[0] + numCol + 1);
  Aindex.assign(&XAindex[0], &XAindex[0] + numNz);
  Avalue.assign(&XAvalue[0], &XAvalue[0] + numNz);
  numTot = numCol + numRow;
  
  // Assign and initialise the scaling factors
  initScale();

  // Initialise with a logical basis then allocate and populate (where
  // possible) work* arrays and allocate basis* arrays
  initWithLogicalBasis();

  totalTime += timer.getTime();
}